

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O1

vector<cfd::js::api::DecodePsbtInputStruct,_std::allocator<cfd::js::api::DecodePsbtInputStruct>_> *
__thiscall
cfd::core::
JsonObjectVector<cfd::js::api::json::DecodePsbtInput,_cfd::js::api::DecodePsbtInputStruct>::
ConvertToStruct(vector<cfd::js::api::DecodePsbtInputStruct,_std::allocator<cfd::js::api::DecodePsbtInputStruct>_>
                *__return_storage_ptr__,
               JsonObjectVector<cfd::js::api::json::DecodePsbtInput,_cfd::js::api::DecodePsbtInputStruct>
               *this)

{
  DecodePsbtInput *pDVar1;
  DecodePsbtInput *this_00;
  DecodePsbtInputStruct data;
  DecodePsbtInputStruct DStack_498;
  
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::DecodePsbtInputStruct,_std::allocator<cfd::js::api::DecodePsbtInputStruct>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::DecodePsbtInputStruct,_std::allocator<cfd::js::api::DecodePsbtInputStruct>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::DecodePsbtInputStruct,_std::allocator<cfd::js::api::DecodePsbtInputStruct>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar1 = (this->super_JsonVector<cfd::js::api::json::DecodePsbtInput>).
           super_vector<cfd::js::api::json::DecodePsbtInput,_std::allocator<cfd::js::api::json::DecodePsbtInput>_>
           .
           super__Vector_base<cfd::js::api::json::DecodePsbtInput,_std::allocator<cfd::js::api::json::DecodePsbtInput>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->super_JsonVector<cfd::js::api::json::DecodePsbtInput>).
                 super_vector<cfd::js::api::json::DecodePsbtInput,_std::allocator<cfd::js::api::json::DecodePsbtInput>_>
                 .
                 super__Vector_base<cfd::js::api::json::DecodePsbtInput,_std::allocator<cfd::js::api::json::DecodePsbtInput>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pDVar1; this_00 = this_00 + 1
      ) {
    js::api::json::DecodePsbtInput::ConvertToStruct(&DStack_498,this_00);
    std::
    vector<cfd::js::api::DecodePsbtInputStruct,_std::allocator<cfd::js::api::DecodePsbtInputStruct>_>
    ::push_back(__return_storage_ptr__,&DStack_498);
    js::api::DecodePsbtInputStruct::~DecodePsbtInputStruct(&DStack_498);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }